

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManEquivSetColors(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int nNodes [2];
  
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x410,"int Gia_ManEquivSetColors(Gia_Man_t *, int)");
  }
  *p->pReprs = (Gia_Rpr_t)((uint)*p->pReprs | 0x40000000);
  *p->pReprs = (Gia_Rpr_t)((uint)*p->pReprs | 0x80000000);
  pVVar7 = p->vCis;
  uVar10 = pVVar7->nSize;
  uVar9 = (ulong)uVar10;
  uVar5 = uVar10 - p->nRegs;
  uVar6 = (ulong)uVar5;
  if (uVar5 != 0 && p->nRegs <= (int)uVar10) {
    lVar4 = 0;
    do {
      if ((int)uVar9 <= lVar4) goto LAB_001fd8cd;
      lVar8 = (long)pVVar7->pArray[lVar4];
      if ((lVar8 < 0) || (p->nObjs <= pVVar7->pArray[lVar4])) goto LAB_001fd8ae;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pReprs[lVar8] = (Gia_Rpr_t)((uint)p->pReprs[lVar8] | 0x40000000);
      p->pReprs[lVar8] = (Gia_Rpr_t)((uint)p->pReprs[lVar8] | 0x80000000);
      lVar4 = lVar4 + 1;
      pVVar7 = p->vCis;
      uVar9 = (ulong)pVVar7->nSize;
      uVar6 = uVar9 - (long)p->nRegs;
    } while (lVar4 < (long)uVar6);
  }
  nNodes[0] = (int)uVar6;
  pVVar7 = p->vCos;
  uVar10 = pVVar7->nSize;
  uVar6 = (ulong)uVar10;
  nNodes[1] = nNodes[0];
  if (p->nRegs < (int)uVar10) {
    lVar4 = 0;
    do {
      uVar10 = (uint)uVar6;
      if ((int)uVar10 <= lVar4) {
LAB_001fd8cd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar7->pArray[lVar4];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_001fd8ae:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar3;
      uVar10 = (uint)lVar4 & 1;
      iVar3 = Gia_ManEquivSetColor_rec
                        (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),uVar10);
      nNodes[uVar10] = nNodes[uVar10] + iVar3;
      lVar4 = lVar4 + 1;
      pVVar7 = p->vCos;
      uVar10 = pVVar7->nSize;
      uVar6 = (ulong)(int)uVar10;
    } while (lVar4 < (long)(uVar6 - (long)p->nRegs));
  }
  iVar2 = nNodes[1];
  iVar3 = p->vCis->nSize;
  iVar3 = (iVar3 + p->nObjs + ~(uVar10 + iVar3)) * 2 - nNodes[0];
  if (fVerbose != 0) {
    Abc_Print(1,"CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n");
  }
  return (iVar3 - iVar2) / 2;
}

Assistant:

int Gia_ManEquivSetColors( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, nNodes[2], nDiffs[2];
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ObjSetColors( p, 0 );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetColors( p, Gia_ObjId(p,pObj) );
    nNodes[0] = nNodes[1] = Gia_ManPiNum(p);
    Gia_ManForEachPo( p, pObj, i )
        nNodes[i&1] += Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), i&1 );
//    Gia_ManForEachObj( p, pObj, i )
//        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
//            assert( Gia_ObjColors(p, i) );
    nDiffs[0] = Gia_ManCandNum(p) - nNodes[0];
    nDiffs[1] = Gia_ManCandNum(p) - nNodes[1];
    if ( fVerbose )
    {
        Abc_Print( 1, "CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n",
            Gia_ManCandNum(p), nNodes[0], nNodes[1], nDiffs[0], nDiffs[1],
            Gia_ManCandNum(p) - nDiffs[0] - nDiffs[1] );
    }
    return (nDiffs[0] + nDiffs[1]) / 2;
}